

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O0

int * Abc_NtkVerifySimulatePattern(Abc_Ntk_t *pNtk,int *pModel)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Abc_Obj_t *pAVar7;
  int *piVar8;
  Abc_Obj_t *pAVar9;
  int local_34;
  int fStrashed;
  int i;
  int Value1;
  int Value0;
  int *pValues;
  Abc_Obj_t *pNode;
  int *pModel_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar3 = Abc_NtkIsStrash(pNtk);
  pModel_local = (int *)pNtk;
  if (iVar3 == 0) {
    pModel_local = (int *)Abc_NtkStrash(pNtk,0,0,0);
  }
  Abc_NtkIncrementTravId((Abc_Ntk_t *)pModel_local);
  pAVar7 = Abc_AigConst1((Abc_Ntk_t *)pModel_local);
  pAVar7->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
  for (local_34 = 0; iVar4 = Abc_NtkCiNum((Abc_Ntk_t *)pModel_local), local_34 < iVar4;
      local_34 = local_34 + 1) {
    pAVar7 = Abc_NtkCi((Abc_Ntk_t *)pModel_local,local_34);
    pAVar7->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)pModel[local_34];
  }
  for (local_34 = 0; iVar4 = Vec_PtrSize(*(Vec_Ptr_t **)(pModel_local + 8)), local_34 < iVar4;
      local_34 = local_34 + 1) {
    pAVar7 = Abc_NtkObj((Abc_Ntk_t *)pModel_local,local_34);
    if ((pAVar7 != (Abc_Obj_t *)0x0) && (iVar4 = Abc_ObjIsNode(pAVar7), iVar4 != 0)) {
      pAVar9 = Abc_ObjFanin0(pAVar7);
      aVar2 = pAVar9->field_6;
      uVar6 = Abc_ObjFaninC0(pAVar7);
      pAVar9 = Abc_ObjFanin1(pAVar7);
      aVar1 = pAVar9->field_6;
      uVar5 = Abc_ObjFaninC1(pAVar7);
      pAVar7->field_6 =
           (anon_union_8_4_617c9805_for_Abc_Obj_t__17)
           (long)(int)((aVar2.iTemp ^ uVar6) & (aVar1.iTemp ^ uVar5));
    }
  }
  iVar4 = Abc_NtkCoNum((Abc_Ntk_t *)pModel_local);
  piVar8 = (int *)malloc((long)iVar4 << 2);
  for (local_34 = 0; iVar4 = Abc_NtkCoNum((Abc_Ntk_t *)pModel_local), local_34 < iVar4;
      local_34 = local_34 + 1) {
    pAVar7 = Abc_NtkCo((Abc_Ntk_t *)pModel_local,local_34);
    pAVar9 = Abc_ObjFanin0(pAVar7);
    aVar2 = pAVar9->field_6;
    uVar6 = Abc_ObjFaninC0(pAVar7);
    piVar8[local_34] = aVar2.iTemp ^ uVar6;
  }
  if (iVar3 == 0) {
    Abc_NtkDelete((Abc_Ntk_t *)pModel_local);
  }
  return piVar8;
}

Assistant:

int * Abc_NtkVerifySimulatePattern( Abc_Ntk_t * pNtk, int * pModel )
{
    Abc_Obj_t * pNode;
    int * pValues, Value0, Value1, i;
    int fStrashed = 0;
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        pNtk = Abc_NtkStrash(pNtk, 0, 0, 0);
        fStrashed = 1;
    }
/*
    printf( "Counter example: " );
    Abc_NtkForEachCi( pNtk, pNode, i )
        printf( " %d", pModel[i] );
    printf( "\n" );
*/
    // increment the trav ID
    Abc_NtkIncrementTravId( pNtk );
    // set the CI values
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)1;
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)pModel[i];
    // simulate in the topological order
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Value0 = ((int)(ABC_PTRINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ (int)Abc_ObjFaninC0(pNode);
        Value1 = ((int)(ABC_PTRINT_T)Abc_ObjFanin1(pNode)->pCopy) ^ (int)Abc_ObjFaninC1(pNode);
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)(Value0 & Value1);
    }
    // fill the output values
    pValues = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        pValues[i] = ((int)(ABC_PTRINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ (int)Abc_ObjFaninC0(pNode);
    if ( fStrashed )
        Abc_NtkDelete( pNtk );
    return pValues;
}